

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::QuantileSortTree::QuantileSortTree
          (QuantileSortTree *this,AggregateInputData *aggr_input_data,
          WindowPartitionInput *partition)

{
  OrderType OVar1;
  ColumnDataCollection *this_00;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> _Var2;
  TemplatedValidityMask<unsigned_long> *this_01;
  sel_t *psVar3;
  idx_t row_idx;
  bool bVar4;
  const_reference cVar5;
  FunctionData *pFVar6;
  reference other;
  pointer pWVar7;
  reference vector;
  sel_t i;
  uint uVar8;
  idx_t filtered;
  ulong row_idx_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d0;
  Expression *local_1c8;
  QuantileSortTree *local_1c0;
  WindowMergeSortTreeLocalState *local_1b8;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_1b0;
  vector<unsigned_long,_true> sort_idx;
  SelectionVector filter_sel;
  idx_t count;
  LogicalType local_160;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  BoundOrderModifier order_bys;
  DataChunk sort;
  ColumnDataScanState scan;
  
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)0x0;
  this_00 = partition->inputs;
  scan.current_chunk_state.handles._M_h._M_buckets =
       &scan.current_chunk_state.handles._M_h._M_single_bucket;
  scan.current_chunk_state.handles._M_h._M_bucket_count = 1;
  scan.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scan.current_chunk_state.handles._M_h._M_element_count = 0;
  scan.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  scan.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  scan.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  scan.current_chunk_state.properties = INVALID;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0 = this;
  DataChunk::DataChunk(&sort);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,
             &(partition->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::InitializeScan
            (this_00,&scan,(vector<unsigned_long,_true> *)&local_148,ALLOW_ZERO_COPY);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_148);
  ColumnDataCollection::InitializeScanChunk(this_00,&scan,&sort);
  pFVar6 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&sort_idx,&sort);
  other = vector<duckdb::LogicalType,_true>::get<true>
                    ((vector<duckdb::LogicalType,_true> *)&sort_idx,0);
  LogicalType::LogicalType(&local_160,other);
  Value::Value((Value *)&order_bys,&local_160);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_1c8,(Value *)&order_bys)
  ;
  Value::~Value((Value *)&order_bys);
  LogicalType::~LogicalType(&local_160);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&sort_idx);
  OVar1 = *(OrderType *)&pFVar6[7]._vptr_FunctionData;
  BoundOrderModifier::BoundOrderModifier(&order_bys);
  local_1d0._M_head_impl = local_1c8;
  local_1c8 = (Expression *)0x0;
  BoundOrderByNode::BoundOrderByNode
            ((BoundOrderByNode *)&sort_idx,OVar1 | ASCENDING,NULLS_LAST,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1d0);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            (&order_bys.orders.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
             (BoundOrderByNode *)&sort_idx);
  BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&sort_idx);
  if (local_1d0._M_head_impl != (Expression *)0x0) {
    (*((local_1d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_1d0._M_head_impl = (Expression *)0x0;
  filter_sel.sel_vector = (sel_t *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sort_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,1,
             (value_type_conflict *)&filter_sel,(allocator_type *)&count);
  count = partition->count;
  make_uniq<duckdb::WindowIndexTree,duckdb::ClientContext&,duckdb::BoundOrderModifier&,duckdb::vector<unsigned_long,true>&,unsigned_long_const&>
            ((duckdb *)&filter_sel,partition->context,&order_bys,&sort_idx,&count);
  psVar3 = filter_sel.sel_vector;
  filter_sel.sel_vector = (sel_t *)0x0;
  _Var2.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (local_1c0->index_tree).
       super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
       .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>;
  (local_1c0->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)psVar3;
  if (_Var2.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl !=
      (WindowIndexTree *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl
                + 8))();
    if (filter_sel.sel_vector != (sel_t *)0x0) {
      (**(code **)(*(long *)filter_sel.sel_vector + 8))();
    }
  }
  pWVar7 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&local_1c0->index_tree);
  (*(pWVar7->super_WindowMergeSortTree)._vptr_WindowMergeSortTree[2])(&local_1b0,pWVar7);
  local_1b8 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                            *)&local_1b0);
  this_01 = &partition->filter_mask->super_TemplatedValidityMask<unsigned_long>;
  SelectionVector::SelectionVector(&filter_sel,0x800);
LAB_01cd1c44:
  do {
    bVar4 = ColumnDataCollection::Scan(this_00,&scan,&sort);
    row_idx = scan.current_row_index;
    if (!bVar4) {
      WindowMergeSortTreeLocalState::Sort(local_1b8);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&filter_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (local_1b0._M_head_impl != (WindowAggregatorState *)0x0) {
        (*(local_1b0._M_head_impl)->_vptr_WindowAggregatorState[1])();
      }
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&sort_idx);
      BoundOrderModifier::~BoundOrderModifier(&order_bys);
      if (local_1c8 != (Expression *)0x0) {
        (**(code **)(*(long *)local_1c8 + 8))();
      }
      DataChunk::~DataChunk(&sort);
      ColumnDataScanState::~ColumnDataScanState(&scan);
      return;
    }
    if (this_01->validity_mask == (unsigned_long *)0x0) {
      cVar5 = vector<bool,_true>::get<true>(&partition->all_valid,0);
      if (cVar5) {
        WindowMergeSortTreeLocalState::SinkChunk
                  (local_1b8,&sort,row_idx,(optional_ptr<duckdb::SelectionVector,_true>)0x0,0);
        goto LAB_01cd1c44;
      }
    }
    vector = vector<duckdb::Vector,_true>::get<true>(&sort.data,0);
    FlatVector::VerifyFlatVector(vector);
    filtered = 0;
    for (uVar8 = 0; row_idx_00 = (ulong)uVar8, row_idx_00 < sort.count; uVar8 = uVar8 + 1) {
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_01,row_idx + row_idx_00);
      if (bVar4) {
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,row_idx_00
                          );
        if (bVar4) {
          filter_sel.sel_vector[filtered] = uVar8;
          filtered = filtered + 1;
        }
      }
    }
    WindowMergeSortTreeLocalState::SinkChunk(local_1b8,&sort,row_idx,&filter_sel,filtered);
  } while( true );
}

Assistant:

QuantileSortTree(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition) {
		// TODO: Two pass parallel sorting using Build
		auto &inputs = *partition.inputs;
		ColumnDataScanState scan;
		DataChunk sort;
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, sort);

		// Sort on the single argument
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();
		auto order_expr = make_uniq<BoundConstantExpression>(Value(sort.GetTypes()[0]));
		auto order_type = bind_data.desc ? OrderType::DESCENDING : OrderType::ASCENDING;
		BoundOrderModifier order_bys;
		order_bys.orders.emplace_back(BoundOrderByNode(order_type, OrderByNullType::NULLS_LAST, std::move(order_expr)));
		vector<column_t> sort_idx(1, 0);
		const auto count = partition.count;

		index_tree = make_uniq<WindowIndexTree>(partition.context, order_bys, sort_idx, count);
		auto index_state = index_tree->GetLocalState();
		auto &local_state = index_state->Cast<WindowIndexTreeLocalState>();

		//	Build the indirection array by scanning the valid indices
		const auto &filter_mask = partition.filter_mask;
		SelectionVector filter_sel(STANDARD_VECTOR_SIZE);
		while (inputs.Scan(scan, sort)) {
			const auto row_idx = scan.current_row_index;
			if (!filter_mask.AllValid() || !partition.all_valid[0]) {
				auto &key = sort.data[0];
				auto &validity = FlatVector::Validity(key);
				idx_t filtered = 0;
				for (sel_t i = 0; i < sort.size(); ++i) {
					if (filter_mask.RowIsValid(i + row_idx) && validity.RowIsValid(i)) {
						filter_sel[filtered++] = i;
					}
				}
				local_state.SinkChunk(sort, row_idx, filter_sel, filtered);
			} else {
				local_state.SinkChunk(sort, row_idx, nullptr, 0);
			}
		}
		local_state.Sort();
	}